

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::AbstractDOMParser::endAttList(AbstractDOMParser *this,DTDElementDecl *elemDecl)

{
  short *psVar1;
  short *psVar2;
  XMLSize_t XVar3;
  DOMDocumentImpl *pDVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  undefined4 extraout_var;
  XMLCh *pXVar9;
  long *plVar10;
  long lVar11;
  long *plVar12;
  ulong uVar13;
  XMLBuffer *pXVar14;
  XMLCh *pXVar15;
  undefined8 uVar16;
  long *plVar17;
  undefined4 extraout_var_03;
  long *plVar18;
  undefined4 extraout_var_04;
  long *plVar19;
  ulong uVar20;
  ulong uVar21;
  XMLCh *chars;
  XMLBufBid bbQName;
  XMLCh temp [1000];
  XMLCh local_808 [1004];
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  bVar5 = DOMDocumentTypeImpl::isIntSubsetReading(this->fDocumentType);
  if (bVar5) {
    pXVar14 = this->fInternalSubset;
    if (pXVar14->fIndex == pXVar14->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar14,1);
    }
    XVar3 = pXVar14->fIndex;
    pXVar14->fIndex = XVar3 + 1;
    pXVar14->fBuffer[XVar3] = L'>';
  }
  iVar6 = (*(elemDecl->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[7])(elemDecl);
  if ((char)iVar6 != '\0') {
    iVar6 = (*(elemDecl->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[5])(elemDecl)
    ;
    plVar19 = (long *)CONCAT44(extraout_var,iVar6);
    pDVar4 = this->fDocument;
    pXVar9 = QName::getRawName((elemDecl->super_XMLElementDecl).fElementName);
    iVar6 = (*(pDVar4->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x38])(pDVar4,pXVar9);
    plVar10 = (long *)CONCAT44(extraout_var_00,iVar6);
    bVar5 = this->fScanner->fDoNamespaces;
    lVar11 = (**(code **)(*plVar19 + 0x50))(plVar19);
    if (lVar11 != 0) {
      uVar21 = 0;
LAB_002e0e82:
      plVar12 = (long *)(**(code **)(*plVar19 + 0x58))(plVar19,uVar21);
      if (plVar12[4] != 0) {
        if (bVar5 != false) {
          pXVar9 = (XMLCh *)(**(code **)(*plVar12 + 0x28))(plVar12);
          uVar20 = 0;
          uVar13 = 0xffffffff;
          iVar6 = 0;
          do {
            if (pXVar9[uVar20] == L':') {
              iVar6 = iVar6 + 1;
              uVar13 = uVar20 & 0xffffffff;
            }
            else if (pXVar9[uVar20] == L'\0') goto LAB_002e0ed6;
            uVar20 = uVar20 + 1;
          } while( true );
        }
        pDVar4 = this->fDocument;
        uVar16 = (**(code **)(*plVar12 + 0x28))(plVar12);
        iVar6 = (*(pDVar4->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x32])(pDVar4,uVar16);
        plVar17 = (long *)CONCAT44(extraout_var_02,iVar6);
        plVar18 = (long *)(**(code **)(*plVar10 + 0x168))(plVar10,plVar17);
        if (plVar18 != (long *)0x0) {
          (**(code **)(*plVar18 + 0x138))(plVar18);
        }
        goto LAB_002e1101;
      }
      goto LAB_002e111f;
    }
LAB_002e1134:
    iVar6 = (*(this->fDocumentType->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0x38])();
    plVar19 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar6) + 0x10))
                                ((long *)CONCAT44(extraout_var_04,iVar6),plVar10);
    if (plVar19 != (long *)0x0) {
      (**(code **)(*plVar19 + 0x138))(plVar19);
    }
  }
  return;
LAB_002e0ed6:
  uVar7 = (uint)uVar13;
  uVar8 = 0xffffffff;
  if (((uVar7 != 0 && (int)uVar20 != 0) && (iVar6 < 2 && (int)uVar20 - 1U != uVar7)) &&
     (uVar8 = uVar7, uVar7 == 0xffffffff)) {
    uVar8 = 0;
  }
  pXVar14 = XMLBufferMgr::bidOnBuffer(&this->fBufMgr);
  if ((int)uVar8 < 1) {
    if (pXVar9 == L"xmlns") {
LAB_002e1095:
      XMLBuffer::append(pXVar14,L"http://www.w3.org/2000/xmlns/");
    }
    else if (pXVar9 != (XMLCh *)0x0) {
      lVar11 = 0;
      do {
        psVar1 = (short *)((long)pXVar9 + lVar11);
        if (*psVar1 == 0) {
          if (*(short *)((long)L"xmlns" + lVar11) == 0) goto LAB_002e1095;
          break;
        }
        psVar2 = (short *)((long)L"xmlns" + lVar11);
        lVar11 = lVar11 + 2;
      } while (*psVar1 == *psVar2);
    }
  }
  else {
    pXVar15 = local_808;
    if (999 < (int)uVar8) {
      iVar6 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                        (this->fMemoryManager,(ulong)(uVar8 * 2 + 2));
      pXVar15 = (XMLCh *)CONCAT44(extraout_var_01,iVar6);
    }
    XMLString::subString(pXVar15,pXVar9,0,(ulong)uVar8,this->fMemoryManager);
    chars = L"http://www.w3.org/2000/xmlns/";
    if (pXVar15 != L"xmlns") {
      if (pXVar15 != (XMLCh *)0x0) {
        lVar11 = 0;
        do {
          psVar1 = (short *)((long)pXVar15 + lVar11);
          if (*psVar1 == 0) {
            chars = L"http://www.w3.org/2000/xmlns/";
            if (*(short *)((long)L"xmlns" + lVar11) == 0) goto LAB_002e105e;
            break;
          }
          psVar2 = (short *)((long)L"xmlns" + lVar11);
          lVar11 = lVar11 + 2;
        } while (*psVar1 == *psVar2);
      }
      chars = L"http://www.w3.org/XML/1998/namespace";
    }
LAB_002e105e:
    XMLBuffer::append(pXVar14,chars);
    if (999 < (int)uVar8) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,pXVar15);
    }
  }
  pDVar4 = this->fDocument;
  pXVar15 = pXVar14->fBuffer;
  pXVar15[pXVar14->fIndex] = L'\0';
  iVar6 = (*(pDVar4->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x53])(pDVar4,pXVar15,pXVar9);
  plVar17 = (long *)CONCAT44(extraout_var_03,iVar6);
  plVar18 = (long *)(**(code **)(*plVar10 + 0x1a0))(plVar10,plVar17);
  if (plVar18 != (long *)0x0) {
    (**(code **)(*plVar18 + 0x138))(plVar18);
  }
  XMLBufferMgr::releaseBuffer(&this->fBufMgr,pXVar14);
LAB_002e1101:
  (**(code **)(*plVar17 + 0x1c0))(plVar17,plVar12[4]);
  (**(code **)(*plVar17 + 0x198))(plVar17,0);
LAB_002e111f:
  uVar21 = uVar21 + 1;
  uVar13 = (**(code **)(*plVar19 + 0x50))(plVar19);
  if (uVar13 <= uVar21) goto LAB_002e1134;
  goto LAB_002e0e82;
}

Assistant:

void AbstractDOMParser::endAttList
(
    const   DTDElementDecl& elemDecl
)
{
    if (fDocumentType->isIntSubsetReading())
    {
        //print the closing angle
        fInternalSubset.append(chCloseAngle);
    }

	// this section sets up default attributes.
	// default attribute nodes are stored in a NamedNodeMap DocumentTypeImpl::elements
	// default attribute data attached to the document is used to conform to the
	// DOM spec regarding creating element nodes & removing attributes with default values
	// see DocumentTypeImpl
	if (elemDecl.hasAttDefs())
	{
        XMLAttDefList* defAttrs = &elemDecl.getAttDefList();
        XMLAttDef* attr = 0;

        DOMAttrImpl * insertAttr = 0;
        DOMElement     *elem  = fDocument->createElement(elemDecl.getFullName());
        DOMElementImpl *elemImpl = (DOMElementImpl *) elem;
        bool doNamespaces = fScanner->getDoNamespaces();

        for(XMLSize_t i=0; i<defAttrs->getAttDefCount(); i++)
        {
            attr = &defAttrs->getAttDef(i);
            if (attr->getValue() != 0)
            {
                if (doNamespaces)
                {
                    // DOM Level 2 wants all namespace declaration attributes
                    // to be bound to "http://www.w3.org/2000/xmlns/"
                    // So as long as the XML parser doesn't do it, it needs to
                    // done here.
                    const XMLCh* qualifiedName = attr->getFullName();
                    int index = DOMDocumentImpl::indexofQualifiedName(qualifiedName);

                    XMLBufBid bbQName(&fBufMgr);
                    XMLBuffer& buf = bbQName.getBuffer();
                    static const XMLCh XMLNS[] = {
                        chLatin_x, chLatin_m, chLatin_l, chLatin_n, chLatin_s, chNull};

                    if (index > 0) {
                        // there is prefix
                        // map to XML URI for all cases except when prefix == "xmlns"
                        XMLCh* prefix;
                        XMLCh temp[1000];

                        if (index > 999)
                            prefix = (XMLCh*) fMemoryManager->allocate
                            (
                                (index + 1) * sizeof(XMLCh)
                            );//new XMLCh[index+1];
                        else
                            prefix = temp;

                        XMLString::subString(prefix ,qualifiedName, 0, index, fMemoryManager);

                        if (XMLString::equals(prefix,XMLNS))
                            buf.append(XMLUni::fgXMLNSURIName);
                        else
                            buf.append(XMLUni::fgXMLURIName);

                        if (index > 999)
                            fMemoryManager->deallocate(prefix);//delete [] prefix;
                    }
                    else {
                        //   No prefix
                        if (XMLString::equals(qualifiedName,XMLNS))
                            buf.append(XMLUni::fgXMLNSURIName);
                    }

                    insertAttr = (DOMAttrImpl *) fDocument->createAttributeNS(
                       buf.getRawBuffer(),     // NameSpaceURI
                       qualifiedName);   // qualified name

                    DOMNode* remAttr = elemImpl->setAttributeNodeNS(insertAttr);
                    if (remAttr)
                        remAttr->release();
                }
                else
                {
                    // Namespaces is turned off...
                    insertAttr = (DOMAttrImpl *) fDocument->createAttribute(attr->getFullName());
                    DOMNode* remAttr = elemImpl->setAttributeNode(insertAttr);
                    if (remAttr)
                        remAttr->release();
                }

                insertAttr->setValueFast(attr->getValue());
                insertAttr->setSpecified(false);
            }
        }
        DOMNode* rem = fDocumentType->getElements()->setNamedItem(elemImpl);
        if (rem)
            rem->release();
    }
}